

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O1

void luaC_step(lua_State *L)

{
  global_State *g;
  ulong uVar1;
  lu_mem lVar2;
  GCObject **ppGVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  GCObject *local_38;
  
  g = L->l_G;
  if (g->gcstp == '\0') {
    if ((g->gckind == '\x01') || (g->lastatomic != 0)) {
      uVar1 = g->lastatomic;
      if (uVar1 == 0) {
        uVar1 = g->GCestimate;
        if ((g->GCdebt < 1) ||
           (uVar5 = (ulong)g->genmajormul * (uVar1 / 100) * 4,
           (ulong)(g->GCdebt + g->totalbytes) <= uVar5 + uVar1)) {
          if (g->gcstate != '\0') {
            __assert_fail("g->gcstate == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                          ,0x540,"void youngcollection(lua_State *, global_State *)");
          }
          if (g->firstold1 != (GCObject *)0x0) {
            markold(g,g->firstold1,g->reallyold);
            g->firstold1 = (GCObject *)0x0;
          }
          markold(g,g->finobj,g->finobjrold);
          markold(g,g->tobefnz,(GCObject *)0x0);
          atomic(L);
          g->gcstate = '\x03';
          ppGVar3 = sweepgen(L,g,&g->allgc,g->survival,&g->firstold1);
          sweepgen(L,g,ppGVar3,g->old1,&g->firstold1);
          g->reallyold = g->old1;
          g->old1 = *ppGVar3;
          g->survival = g->allgc;
          local_38 = (GCObject *)0x0;
          ppGVar3 = sweepgen(L,g,&g->finobj,g->finobjsur,&local_38);
          sweepgen(L,g,ppGVar3,g->finobjold1,&local_38);
          g->finobjrold = g->finobjold1;
          g->finobjold1 = *ppGVar3;
          g->finobjsur = g->finobj;
          sweepgen(L,g,&g->tobefnz,(GCObject *)0x0,&local_38);
          finishgencycle(L,g);
          luaE_setdebt(g,-((ulong)g->genminormul * ((ulong)(g->GCdebt + g->totalbytes) / 100)));
          g->GCestimate = uVar1;
        }
        else {
          enterinc(g);
          lVar2 = entergen(L,g);
          if ((ulong)(g->GCdebt + g->totalbytes) < (uVar5 >> 1) + uVar1) {
            if (g->lastatomic != 0) {
              __assert_fail("g->lastatomic == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                            ,0x607,"void genstep(lua_State *, global_State *)");
            }
          }
          else {
            g->lastatomic = lVar2;
            setpause(g);
          }
        }
      }
      else {
        if (g->gckind == '\x01') {
          enterinc(g);
        }
        luaC_runtilstate(L,1);
        lVar2 = atomic(L);
        if (lVar2 < (uVar1 >> 3) + uVar1) {
          atomic2gen(L,g);
          luaE_setdebt(g,-((ulong)g->genminormul * ((ulong)(g->GCdebt + g->totalbytes) / 100)));
        }
        else {
          g->GCestimate = g->GCdebt + g->totalbytes;
          entersweep(L);
          luaC_runtilstate(L,0x100);
          setpause(g);
          g->lastatomic = lVar2;
        }
      }
      if ((g->gckind != '\x01') && (g->lastatomic == 0)) {
        __assert_fail("(g->gckind == 1 || g->lastatomic != 0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                      ,0x614,"void genstep(lua_State *, global_State *)");
      }
      return;
    }
    lVar4 = (ulong)g->gcstepmul * 4 + 1;
    lVar7 = ((ulong)g->GCdebt >> 4) * lVar4;
    lVar6 = 0x7fffffffffffffff;
    if (g->gcstepsize < 0x3f) {
      lVar6 = ((ulong)(1L << ((ulong)g->gcstepsize & 0x3f)) >> 4) * lVar4;
    }
    do {
      lVar2 = singlestep(L);
      lVar7 = lVar7 - lVar2;
      if (lVar7 == -lVar6 || SBORROW8(lVar7,-lVar6) != lVar7 + lVar6 < 0) break;
    } while (g->gcstate != '\b');
    if (g->gcstate == '\b') {
      setpause(g);
      return;
    }
    lVar4 = lVar7 / lVar4 << 4;
  }
  else {
    lVar4 = -2000;
  }
  luaE_setdebt(g,lVar4);
  return;
}

Assistant:

void luaC_step (lua_State *L) {
  global_State *g = G(L);
  if (!gcrunning(g))  /* not running? */
    luaE_setdebt(g, -2000);
  else {
    if(isdecGCmodegen(g))
      genstep(L, g);
    else
      incstep(L, g);
  }
}